

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O3

void PacketSend(void)

{
  uint uVar1;
  size_t __n;
  BYTE *__buf;
  uLong size;
  ulong local_18;
  
  if (14000 < doomcom.datalength) {
    I_FatalError("Netbuffer overflow!");
  }
  if ((doomcom.data[0] & 4) != 0) {
    __assert_fail("!(doomcom.data[0] & NCMD_COMPRESSED)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/i_net.cpp"
                  ,0xd4,"void PacketSend()");
  }
  local_18 = 7999;
  if (9 < (long)doomcom.datalength) {
    TransmitBuffer[0] = doomcom.data[0] | 4;
    uVar1 = compress2(TransmitBuffer + 1,&local_18,0x17d38b5,(long)doomcom.datalength + -1,9);
    __n = local_18 + 1;
    local_18 = __n;
    if (__n < (ulong)(long)doomcom.datalength && uVar1 == 0) {
      __buf = TransmitBuffer;
      goto LAB_0039b691;
    }
    if (8000 < doomcom.datalength) {
      I_Error("Net compression failed (zlib error %d)",(ulong)uVar1);
      return;
    }
  }
  __n = (size_t)doomcom.datalength;
  __buf = doomcom.data;
LAB_0039b691:
  sendto(mysocket,__buf,__n,0,(sockaddr *)(sendaddress + doomcom.remotenode),0x10);
  return;
}

Assistant:

void PacketSend (void)
{
	int c;

	// FIXME: Catch this before we've overflown the buffer. With long chat
	// text and lots of backup tics, it could conceivably happen. (Though
	// apparently it hasn't yet, which is good.)
	if (doomcom.datalength > MAX_MSGLEN)
	{
		I_FatalError("Netbuffer overflow!");
	}
	assert(!(doomcom.data[0] & NCMD_COMPRESSED));

	uLong size = TRANSMIT_SIZE - 1;
	if (doomcom.datalength >= 10)
	{
		TransmitBuffer[0] = doomcom.data[0] | NCMD_COMPRESSED;
		c = compress2(TransmitBuffer + 1, &size, doomcom.data + 1, doomcom.datalength - 1, 9);
		size += 1;
	}
	else
	{
		c = -1;	// Just some random error code to avoid sending the compressed buffer.
	}
	if (c == Z_OK && size < (uLong)doomcom.datalength)
	{
//		Printf("send %lu/%d\n", size, doomcom.datalength);
		c = sendto(mysocket, (char *)TransmitBuffer, size,
			0, (sockaddr *)&sendaddress[doomcom.remotenode],
			sizeof(sendaddress[doomcom.remotenode]));
	}
	else
	{
		if (doomcom.datalength > TRANSMIT_SIZE)
		{
			I_Error("Net compression failed (zlib error %d)", c);
		}
		else
		{
//			Printf("send %d\n", doomcom.datalength);
			c = sendto(mysocket, (char *)doomcom.data, doomcom.datalength,
				0, (sockaddr *)&sendaddress[doomcom.remotenode],
				sizeof(sendaddress[doomcom.remotenode]));
		}
	}
	//	if (c == -1)
	//			I_Error ("SendPacket error: %s",strerror(errno));
}